

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O0

wchar_t tok_wline(TokenizerW *tok,LineInfoW *line,wchar_t *argc,wchar_t ***argv,wchar_t *cursorc,
                 wchar_t *cursoro)

{
  wchar_t wVar1;
  long lVar2;
  wchar_t *pwVar3;
  wchar_t **ppwVar4;
  wchar_t **p;
  size_t i;
  wchar_t *s;
  size_t size;
  wchar_t co;
  wchar_t cc;
  wchar_t *ptr;
  wchar_t *cursoro_local;
  wchar_t *cursorc_local;
  wchar_t ***argv_local;
  wchar_t *argc_local;
  LineInfoW *line_local;
  TokenizerW *tok_local;
  
  size._0_4_ = L'\xffffffff';
  size._4_4_ = L'\xffffffff';
  _co = line->buffer;
  do {
    if (line->lastchar <= _co) {
      _co = anon_var_dwarf_1b5e2 + 3;
    }
    if (_co == line->cursor) {
      size._4_4_ = (wchar_t)tok->argc;
      size._0_4_ = (wchar_t)((long)tok->wptr - (long)tok->wstart >> 2);
    }
    wVar1 = *_co;
    if (wVar1 == L'\0') {
      switch(tok->quote) {
      case Q_none:
        if ((tok->flags & 2U) != 0) {
          tok->flags = tok->flags & 0xfffffffd;
          return L'\x03';
        }
LAB_0012dfd2:
        if ((size._4_4_ == L'\xffffffff') && ((wchar_t)size == L'\xffffffff')) {
          size._4_4_ = (wchar_t)tok->argc;
          size._0_4_ = (wchar_t)((long)tok->wptr - (long)tok->wstart >> 2);
        }
        if (cursorc != (wchar_t *)0x0) {
          *cursorc = size._4_4_;
        }
        if (cursoro != (wchar_t *)0x0) {
          *cursoro = (wchar_t)size;
        }
        tok_wfinish(tok);
        *argv = tok->argv;
        *argc = (wchar_t)tok->argc;
        return L'\0';
      case Q_single:
        return L'\x01';
      case Q_double:
        return L'\x02';
      case Q_one:
        tok->quote = Q_none;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_doubleone:
        tok->quote = Q_double;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      default:
        return L'\xffffffff';
      }
    }
    else if (wVar1 == L'\n') {
      tok->flags = tok->flags & 0xfffffffd;
      switch(tok->quote) {
      case Q_none:
        goto LAB_0012dfd2;
      case Q_single:
      case Q_double:
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_one:
        tok->flags = tok->flags | 2;
        tok->quote = Q_none;
        break;
      case Q_doubleone:
        tok->flags = tok->flags | 2;
        tok->quote = Q_double;
        break;
      default:
        return L'\0';
      }
    }
    else if (wVar1 == L'\"') {
      tok->flags = tok->flags & 0xfffffffd;
      tok->flags = tok->flags | 1;
      switch(tok->quote) {
      case Q_none:
        tok->quote = Q_double;
        break;
      case Q_single:
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_double:
        tok->quote = Q_none;
        break;
      case Q_one:
        tok->quote = Q_none;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_doubleone:
        tok->quote = Q_double;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      default:
        return L'\xffffffff';
      }
    }
    else if (wVar1 == L'\'') {
      tok->flags = tok->flags | 1;
      tok->flags = tok->flags & 0xfffffffd;
      switch(tok->quote) {
      case Q_none:
        tok->quote = Q_single;
        break;
      case Q_single:
        tok->quote = Q_none;
        break;
      case Q_double:
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_one:
        tok->quote = Q_none;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_doubleone:
        tok->quote = Q_double;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      default:
        return L'\xffffffff';
      }
    }
    else if (wVar1 == L'\\') {
      tok->flags = tok->flags | 1;
      tok->flags = tok->flags & 0xfffffffd;
      switch(tok->quote) {
      case Q_none:
        tok->quote = Q_one;
        break;
      case Q_single:
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_double:
        tok->quote = Q_doubleone;
        break;
      case Q_one:
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        tok->quote = Q_none;
        break;
      case Q_doubleone:
        tok->quote = Q_double;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      default:
        return L'\xffffffff';
      }
    }
    else {
      tok->flags = tok->flags & 0xfffffffd;
      switch(tok->quote) {
      case Q_none:
        pwVar3 = wcschr(tok->ifs,*_co);
        if (pwVar3 == (wchar_t *)0x0) {
          wVar1 = *_co;
          pwVar3 = tok->wptr;
          tok->wptr = pwVar3 + 1;
          *pwVar3 = wVar1;
        }
        else {
          tok_wfinish(tok);
        }
        break;
      case Q_single:
      case Q_double:
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_one:
        tok->quote = Q_none;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      case Q_doubleone:
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = L'\\';
        tok->quote = Q_double;
        wVar1 = *_co;
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
        break;
      default:
        return L'\xffffffff';
      }
    }
    if (tok->wmax + -4 <= tok->wptr) {
      lVar2 = ((long)tok->wmax - (long)tok->wspace >> 2) + 0x14;
      pwVar3 = (wchar_t *)realloc(tok->wspace,lVar2 * 4);
      if (pwVar3 == (wchar_t *)0x0) {
        return L'\xffffffff';
      }
      if (pwVar3 != tok->wspace) {
        for (p = (wchar_t **)0x0; p < (wchar_t **)tok->argc; p = (wchar_t **)((long)p + 1)) {
          tok->argv[(long)p] = pwVar3 + ((long)tok->argv[(long)p] - (long)tok->wspace >> 2);
        }
        tok->wptr = pwVar3 + ((long)tok->wptr - (long)tok->wspace >> 2);
        tok->wstart = pwVar3 + ((long)tok->wstart - (long)tok->wspace >> 2);
        tok->wspace = pwVar3;
      }
      tok->wmax = pwVar3 + lVar2;
    }
    if (tok->amax - 4 <= tok->argc) {
      tok->amax = tok->amax + 10;
      ppwVar4 = (wchar_t **)realloc(tok->argv,tok->amax << 3);
      if (ppwVar4 == (wchar_t **)0x0) {
        tok->amax = tok->amax - 10;
        return L'\xffffffff';
      }
      tok->argv = ppwVar4;
    }
    _co = _co + 1;
  } while( true );
}

Assistant:

int
FUN(tok,line)(TYPE(Tokenizer) *tok, const TYPE(LineInfo) *line,
    int *argc, const Char ***argv, int *cursorc, int *cursoro)
{
	const Char *ptr;
	int cc, co;

	cc = co = -1;
	ptr = line->buffer;
	for (ptr = line->buffer; ;ptr++) {
		if (ptr >= line->lastchar)
			ptr = STR("");
		if (ptr == line->cursor) {
			cc = (int)tok->argc;
			co = (int)(tok->wptr - tok->wstart);
		}
		switch (*ptr) {
		case '\'':
			tok->flags |= TOK_KEEP;
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				tok->quote = Q_single;	/* Enter single quote
							 * mode */
				break;

			case Q_single:	/* Exit single quote mode */
				tok->quote = Q_none;
				break;

			case Q_one:	/* Quote this ' */
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			case Q_double:	/* Stay in double quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this ' */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '"':
			tok->flags &= ~TOK_EAT;
			tok->flags |= TOK_KEEP;
			switch (tok->quote) {
			case Q_none:	/* Enter double quote mode */
				tok->quote = Q_double;
				break;

			case Q_double:	/* Exit double quote mode */
				tok->quote = Q_none;
				break;

			case Q_one:	/* Quote this " */
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			case Q_single:	/* Stay in single quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this " */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '\\':
			tok->flags |= TOK_KEEP;
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:	/* Quote next character */
				tok->quote = Q_one;
				break;

			case Q_double:	/* Quote next character */
				tok->quote = Q_doubleone;
				break;

			case Q_one:	/* Quote this, restore state */
				*tok->wptr++ = *ptr;
				tok->quote = Q_none;
				break;

			case Q_single:	/* Stay in single quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this \ */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '\n':
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				goto tok_line_outok;

			case Q_single:
			case Q_double:
				*tok->wptr++ = *ptr;	/* Add the return */
				break;

			case Q_doubleone:   /* Back to double, eat the '\n' */
				tok->flags |= TOK_EAT;
				tok->quote = Q_double;
				break;

			case Q_one:	/* No quote, more eat the '\n' */
				tok->flags |= TOK_EAT;
				tok->quote = Q_none;
				break;

			default:
				return 0;
			}
			break;

		case '\0':
			switch (tok->quote) {
			case Q_none:
				/* Finish word and return */
				if (tok->flags & TOK_EAT) {
					tok->flags &= ~TOK_EAT;
					return 3;
				}
				goto tok_line_outok;

			case Q_single:
				return 1;

			case Q_double:
				return 2;

			case Q_doubleone:
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			case Q_one:
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		default:
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				if (Strchr(tok->ifs, *ptr) != NULL)
					FUN(tok,finish)(tok);
				else
					*tok->wptr++ = *ptr;
				break;

			case Q_single:
			case Q_double:
				*tok->wptr++ = *ptr;
				break;


			case Q_doubleone:
				*tok->wptr++ = '\\';
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			case Q_one:
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;

			}
			break;
		}

		if (tok->wptr >= tok->wmax - 4) {
			size_t size = (size_t)(tok->wmax - tok->wspace + WINCR);
			Char *s = tok_realloc(tok->wspace,
			    size * sizeof(*s));
			if (s == NULL)
				return -1;

			if (s != tok->wspace) {
				size_t i;
				for (i = 0; i < tok->argc; i++) {
				    tok->argv[i] =
					(tok->argv[i] - tok->wspace) + s;
				}
				tok->wptr = (tok->wptr - tok->wspace) + s;
				tok->wstart = (tok->wstart - tok->wspace) + s;
				tok->wspace = s;
			}
			tok->wmax = s + size;
		}
		if (tok->argc >= tok->amax - 4) {
			const Char **p;
			tok->amax += AINCR;
			p = tok_realloc(tok->argv, tok->amax * sizeof(*p));
			if (p == NULL) {
				tok->amax -= AINCR;
				return -1;
			}
			tok->argv = p;
		}
	}
 tok_line_outok:
	if (cc == -1 && co == -1) {
		cc = (int)tok->argc;
		co = (int)(tok->wptr - tok->wstart);
	}
	if (cursorc != NULL)
		*cursorc = cc;
	if (cursoro != NULL)
		*cursoro = co;
	FUN(tok,finish)(tok);
	*argv = tok->argv;
	*argc = (int)tok->argc;
	return 0;
}